

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_get_nonexist_many(planck_unit_test_t *tc)

{
  undefined4 local_80;
  undefined4 local_7c;
  undefined1 local_78 [8];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  bhdct_setup(tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)local_78,
              ion_fill_edge_cases);
  local_7c = 0xfffff830;
  bhdct_get(tc,(ion_dictionary_t *)local_78,&local_7c,(ion_value_t)0x0,'\x01',0);
  local_80 = 3000;
  bhdct_get(tc,(ion_dictionary_t *)local_78,&local_80,(ion_value_t)0x0,'\x01',0);
  bhdct_takedown(tc,(ion_dictionary_t *)local_78);
  return;
}

Assistant:

void
test_bhdct_get_nonexist_many(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	bhdct_get(tc, &dict, IONIZE(-2000, int), NULL, err_item_not_found, 0);
	bhdct_get(tc, &dict, IONIZE(3000, int), NULL, err_item_not_found, 0);

	bhdct_takedown(tc, &dict);
}